

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O0

void __thiscall embree::Tutorial::keypressed(Tutorial *this,int key)

{
  int in_ESI;
  TutorialApplication *in_RDI;
  
  if (in_ESI == 0x122) {
    renderFrame = renderFrameStandard;
    shader = SHADER_DEFAULT;
    g_changed = true;
  }
  else if (in_ESI == 0x123) {
    renderFrame = renderFrameDebugShader;
    shader = SHADER_EYELIGHT;
    g_changed = true;
  }
  else if (in_ESI == 0x124) {
    renderFrame = renderFrameDebugShader;
    shader = SHADER_OCCLUSION;
    g_changed = true;
  }
  else if (in_ESI == 0x125) {
    renderFrame = renderFrameDebugShader;
    shader = SHADER_UV;
    g_changed = true;
  }
  else if (in_ESI == 0x126) {
    renderFrame = renderFrameDebugShader;
    shader = SHADER_NG;
    g_changed = true;
  }
  else if (in_ESI == 0x127) {
    renderFrame = renderFrameDebugShader;
    shader = SHADER_GEOMID;
    g_changed = true;
  }
  else if (in_ESI == 0x128) {
    renderFrame = renderFrameDebugShader;
    shader = SHADER_GEOMID_PRIMID;
    g_changed = true;
  }
  else if (in_ESI == 0x129) {
    renderFrame = renderFrameDebugShader;
    if (shader == SHADER_TEXCOORDS) {
      shader = SHADER_TEXCOORDS_GRID;
    }
    else {
      shader = SHADER_TEXCOORDS;
    }
    g_changed = true;
  }
  else if (in_ESI == 0x12a) {
    if (shader == SHADER_CYCLES) {
      ::scale = ::scale * 2.0;
    }
    renderFrame = renderFrameDebugShader;
    shader = SHADER_CYCLES;
    g_changed = true;
  }
  else if (in_ESI == 299) {
    if (shader == SHADER_CYCLES) {
      ::scale = ::scale * 0.5;
    }
    renderFrame = renderFrameDebugShader;
    shader = SHADER_CYCLES;
    g_changed = true;
  }
  else {
    TutorialApplication::keypressed(in_RDI,in_ESI);
  }
  return;
}

Assistant:

void keypressed(int key) override
    {
      if (key == GLFW_KEY_F1) {
        renderFrame = renderFrameStandard;
        shader = SHADER_DEFAULT;
        g_changed = true;
      }
      else if (key == GLFW_KEY_F2) {
        renderFrame = renderFrameDebugShader;
        shader = SHADER_EYELIGHT;
        g_changed = true;
      }
      else if (key == GLFW_KEY_F3) {
        renderFrame = renderFrameDebugShader;
        shader = SHADER_OCCLUSION;
        g_changed = true;
      }
      else if (key == GLFW_KEY_F4) {
        renderFrame = renderFrameDebugShader;
        shader = SHADER_UV;
        g_changed = true;
      }
      else if (key == GLFW_KEY_F5) {
        renderFrame = renderFrameDebugShader;
        shader = SHADER_NG;
        g_changed = true;
      }
      else if (key == GLFW_KEY_F6) {
        renderFrame = renderFrameDebugShader;
        shader = SHADER_GEOMID;
        g_changed = true;
      }
      else if (key == GLFW_KEY_F7) {
        renderFrame = renderFrameDebugShader;
        shader = SHADER_GEOMID_PRIMID;
        g_changed = true;
      }
      else if (key == GLFW_KEY_F8) {
        renderFrame = renderFrameDebugShader;
        if (shader == SHADER_TEXCOORDS) shader = SHADER_TEXCOORDS_GRID;
        else                            shader = SHADER_TEXCOORDS;
        g_changed = true;
      }
      else if (key == GLFW_KEY_F9) {
        if (shader == SHADER_CYCLES) scale *= 2.0f;
        renderFrame = renderFrameDebugShader;
        shader = SHADER_CYCLES; 
        g_changed = true;
      }
      else if (key == GLFW_KEY_F10) {
        if (shader == SHADER_CYCLES) scale *= 0.5f;
        renderFrame = renderFrameDebugShader;
        shader = SHADER_CYCLES; 
        g_changed = true;
      }
      else
        TutorialApplication::keypressed(key);
    }